

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O0

Action __thiscall
psy::C::SyntaxDumper::visitFunctionDefinition(SyntaxDumper *this,FunctionDefinitionSyntax *node)

{
  DeclaratorSyntax *pDVar1;
  CompoundStatementSyntax *pCVar2;
  ExtKR_ParameterDeclarationListSyntax *local_28;
  ExtKR_ParameterDeclarationListSyntax *iter_1;
  SpecifierListSyntax *iter;
  FunctionDefinitionSyntax *node_local;
  SyntaxDumper *this_local;
  
  traverseDeclaration(this,(DeclarationSyntax *)node);
  for (iter_1 = (ExtKR_ParameterDeclarationListSyntax *)FunctionDefinitionSyntax::specifiers(node);
      iter_1 != (ExtKR_ParameterDeclarationListSyntax *)0x0;
      iter_1 = *(ExtKR_ParameterDeclarationListSyntax **)(iter_1 + 0x10)) {
    (**(code **)(*(long *)this + 0x2f0))(this,*(undefined8 *)(iter_1 + 8));
  }
  pDVar1 = FunctionDefinitionSyntax::declarator(node);
  (**(code **)(*(long *)this + 0x2f0))(this,pDVar1);
  for (local_28 = FunctionDefinitionSyntax::extKR_params(node);
      local_28 != (ExtKR_ParameterDeclarationListSyntax *)0x0;
      local_28 = *(ExtKR_ParameterDeclarationListSyntax **)(local_28 + 0x10)) {
    (**(code **)(*(long *)this + 0x2f0))(this,*(undefined8 *)(local_28 + 8));
  }
  pCVar2 = FunctionDefinitionSyntax::body(node);
  (**(code **)(*(long *)this + 0x2f0))(this,pCVar2);
  return Skip;
}

Assistant:

virtual Action visitFunctionDefinition(const FunctionDefinitionSyntax* node) override
    {
        traverseDeclaration(node);
        for (auto iter = node->specifiers(); iter; iter = iter->next)
            nonterminal(iter->value);
        nonterminal(node->declarator());
        for (auto iter = node->extKR_params(); iter; iter = iter->next)
            nonterminal(iter->value);
        nonterminal(node->body());
        return Action::Skip;
    }